

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapUniq.c
# Opt level: O0

int Amap_LibFindMux(Amap_Lib_t *p,int iFan0,int iFan1,int iFan2)

{
  int iVar1;
  int local_28;
  int x;
  int iFan2_local;
  int iFan1_local;
  int iFan0_local;
  Amap_Lib_t *p_local;
  
  local_28 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vRules3);
    if (iVar1 <= local_28) {
      return -1;
    }
    iVar1 = Vec_IntEntry(p->vRules3,local_28);
    if (((iVar1 == iFan0) && (iVar1 = Vec_IntEntry(p->vRules3,local_28 + 1), iVar1 == iFan1)) &&
       (iVar1 = Vec_IntEntry(p->vRules3,local_28 + 2), iVar1 == iFan2)) break;
    local_28 = local_28 + 4;
  }
  iVar1 = Vec_IntEntry(p->vRules3,local_28 + 3);
  return iVar1;
}

Assistant:

int Amap_LibFindMux( Amap_Lib_t * p, int iFan0, int iFan1, int iFan2 )
{
    int x;
    for ( x = 0; x < Vec_IntSize(p->vRules3); x += 4 )
    {
        if ( Vec_IntEntry(p->vRules3, x)   == iFan0 &&
             Vec_IntEntry(p->vRules3, x+1) == iFan1 &&
             Vec_IntEntry(p->vRules3, x+2) == iFan2 )
        {
            return Vec_IntEntry(p->vRules3, x+3);
        }
    }
    return -1;
}